

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O0

void btreeblk_set_dirty(void *voidhandle,bid_t bid)

{
  bid_t in_RSI;
  long in_RDI;
  size_t idx;
  size_t sb;
  bid_t filebid;
  bid_t _bid;
  btreeblk_block *block;
  list_elem *e;
  btreeblk_handle *handle;
  size_t local_48 [2];
  list_elem *local_38;
  ulong local_30;
  list_elem *local_28;
  list_elem *local_20;
  long local_18;
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_18 = in_RDI;
  subbid2bid(in_RSI,local_48 + 1,local_48,&local_30);
  local_38 = (list_elem *)(local_30 / *(ushort *)(local_18 + 4));
  local_20 = list_begin((list *)(local_18 + 0x28));
  while( true ) {
    if (local_20 == (list_elem *)0x0) {
      return;
    }
    local_28 = local_20 + -2;
    if (local_28->prev == local_38) break;
    local_20 = list_next(local_20);
  }
  *(undefined1 *)&local_20[-1].prev = 1;
  return;
}

Assistant:

void btreeblk_set_dirty(void *voidhandle, bid_t bid)
{
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;
    struct list_elem *e;
    struct btreeblk_block *block;
    bid_t _bid;
    bid_t filebid;
    size_t sb, idx;

    sb = idx = 0;
    subbid2bid(bid, &sb, &idx, &_bid);
    filebid = _bid / handle->nnodeperblock;

    // list
    e = list_begin(&handle->read_list);
    while(e){
        block = _get_entry(e, struct btreeblk_block, le);
        if (block->bid == filebid) {
            block->dirty = 1;
            break;
        }
        e = list_next(e);
    }
}